

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTest.cpp
# Opt level: O3

void __thiscall PathTest::NormalizeTest(PathTest *this)

{
  int iVar1;
  long lVar2;
  Path p;
  allocator<char> local_51;
  long *local_50 [2];
  long local_40 [2];
  
  lVar2 = 0;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,*(char **)((long)&normalizeTestData[0].path + lVar2),&local_51);
    JetHead::Path::normalize();
    iVar1 = std::__cxx11::string::compare((char *)local_50);
    if (iVar1 != 0) {
      TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/PathTest.cpp"
                 ,0xce,"Normalize of %s failed (%s)",
                 *(undefined8 *)((long)&normalizeTestData[0].path + lVar2),local_50[0]);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0xb0);
  return;
}

Assistant:

void PathTest::NormalizeTest()
{
	for ( int i = 0; i < JH_ARRAY_SIZE( normalizeTestData ); i++ )
	{
		Path p = normalizeTestData[ i ].path;
		p.normalize();
		if ( p != normalizeTestData[ i ].norm_path )
			TestFailed( "Normalize of %s failed (%s)", normalizeTestData[ i ].path, p.getString().c_str() );
	}
}